

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvtBroadphase.cpp
# Opt level: O2

void __thiscall cbtDbvtBroadphase::resetPool(cbtDbvtBroadphase *this,cbtDispatcher *dispatcher)

{
  int i;
  long lVar1;
  undefined1 auVar2 [16];
  
  if (*(int *)&this->field_0x1c + *(int *)&this->field_0x5c == 0) {
    cbtDbvt::clear((cbtDbvt *)&this->field_0x8);
    cbtDbvt::clear((cbtDbvt *)&this->field_0x48);
    this->m_deferedcollide = false;
    this->m_needcleanup = true;
    this->m_stageCurrent = 0;
    this->m_fupdates = 1;
    this->m_dupdates = 0;
    this->m_cupdates = 10;
    this->m_newpairs = 1;
    this->m_fixedleft = 0;
    this->m_cid = 0;
    this->m_gid = 0;
    auVar2 = ZEXT816(0) << 0x20;
    this->m_updates_call = auVar2._0_4_;
    this->m_updates_done = auVar2._4_4_;
    this->m_updates_ratio = (cbtScalar)auVar2._8_4_;
    this->m_pid = auVar2._12_4_;
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      this->m_stageRoots[lVar1] = (cbtDbvtProxy *)0x0;
    }
  }
  return;
}

Assistant:

void cbtDbvtBroadphase::resetPool(cbtDispatcher* dispatcher)
{
	int totalObjects = m_sets[0].m_leaves + m_sets[1].m_leaves;
	if (!totalObjects)
	{
		//reset internal dynamic tree data structures
		m_sets[0].clear();
		m_sets[1].clear();

		m_deferedcollide = false;
		m_needcleanup = true;
		m_stageCurrent = 0;
		m_fixedleft = 0;
		m_fupdates = 1;
		m_dupdates = 0;
		m_cupdates = 10;
		m_newpairs = 1;
		m_updates_call = 0;
		m_updates_done = 0;
		m_updates_ratio = 0;

		m_gid = 0;
		m_pid = 0;
		m_cid = 0;
		for (int i = 0; i <= STAGECOUNT; ++i)
		{
			m_stageRoots[i] = 0;
		}
	}
}